

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall kj::PathPtr::operator<(PathPtr *this,PathPtr other)

{
  ulong uVar1;
  int iVar2;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> WVar3;
  String *pSVar4;
  char *__s1;
  char *__s2;
  size_t sVar5;
  size_t sVar6;
  size_t sStack_40;
  int comp;
  size_t local_38;
  ulong local_30;
  size_t i;
  PathPtr *this_local;
  PathPtr other_local;
  
  other_local.parts.ptr = (String *)other.parts.size_;
  this_local = (PathPtr *)other.parts.ptr;
  local_30 = 0;
  i = (size_t)this;
  while( true ) {
    uVar1 = local_30;
    local_38 = ArrayPtr<const_kj::String>::size(&this->parts);
    sStack_40 = ArrayPtr<const_kj::String>::size((ArrayPtr<const_kj::String> *)&this_local);
    WVar3 = min<unsigned_long,unsigned_long>(&local_38,&stack0xffffffffffffffc0);
    if (WVar3 <= uVar1) {
      sVar5 = ArrayPtr<const_kj::String>::size(&this->parts);
      sVar6 = ArrayPtr<const_kj::String>::size((ArrayPtr<const_kj::String> *)&this_local);
      return sVar5 < sVar6;
    }
    pSVar4 = ArrayPtr<const_kj::String>::operator[](&this->parts,local_30);
    __s1 = String::cStr(pSVar4);
    pSVar4 = ArrayPtr<const_kj::String>::operator[]
                       ((ArrayPtr<const_kj::String> *)&this_local,local_30);
    __s2 = String::cStr(pSVar4);
    iVar2 = strcmp(__s1,__s2);
    if (iVar2 < 0) break;
    if (0 < iVar2) {
      return false;
    }
    local_30 = local_30 + 1;
  }
  return true;
}

Assistant:

bool PathPtr::operator< (PathPtr other) const {
  for (size_t i = 0; i < kj::min(parts.size(), other.parts.size()); i++) {
    int comp = strcmp(parts[i].cStr(), other.parts[i].cStr());
    if (comp < 0) return true;
    if (comp > 0) return false;
  }

  return parts.size() < other.parts.size();
}